

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O3

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  FSE_DTable FVar4;
  FSE_DTable FVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  ulong uVar22;
  bool bVar23;
  
  puVar9 = (undefined1 *)((long)dst + (originalSize - 3));
  if (*(short *)((long)dt + 2) != 0) {
    if (cSrcSize == 0) {
      return 0xffffffffffffffb8;
    }
    if (cSrcSize < 8) {
      uVar17 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar17 = uVar17 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      }
      bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar1 == 0) {
        return 0xffffffffffffffec;
      }
      uVar15 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      iVar14 = (uVar15 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
      lVar7 = 0;
    }
    else {
      bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar1 == 0) {
        return 0xffffffffffffffff;
      }
      if (0xffffffffffffff88 < cSrcSize) {
        return cSrcSize;
      }
      uVar17 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      lVar7 = cSrcSize - 8;
      uVar15 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      iVar14 = ~uVar15 + 9;
    }
    uVar3 = (ushort)*dt;
    uVar15 = iVar14 + (uint)uVar3;
    uVar10 = uVar17 >> (-(char)uVar15 & 0x3fU);
    if (uVar15 < 0x41) {
      if (lVar7 < 8) {
        if (lVar7 == 0) {
          lVar7 = 0;
          goto LAB_0050dd2d;
        }
        uVar6 = (uint)lVar7;
        if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
          uVar6 = uVar15 >> 3;
        }
        uVar15 = uVar15 + uVar6 * -8;
      }
      else {
        uVar6 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
      }
      lVar7 = lVar7 - (ulong)uVar6;
      uVar17 = *(ulong *)((long)cSrc + lVar7);
    }
LAB_0050dd2d:
    uVar15 = uVar15 + uVar3;
    uVar11 = (ulong)((uint)uVar10 & BIT_mask[uVar3]);
    uVar10 = (ulong)(BIT_mask[uVar3] & (uint)(uVar17 >> (-(char)uVar15 & 0x3fU)));
    if (uVar15 < 0x41) {
      if (lVar7 < 8) {
        if (lVar7 == 0) {
          lVar7 = 0;
          goto LAB_0050dd84;
        }
        uVar6 = (uint)lVar7;
        if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
          uVar6 = uVar15 >> 3;
        }
        uVar15 = uVar15 + uVar6 * -8;
      }
      else {
        uVar6 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
      }
      lVar7 = lVar7 - (ulong)uVar6;
      uVar17 = *(ulong *)((long)cSrc + lVar7);
    }
LAB_0050dd84:
    puVar20 = (undefined1 *)dst;
    if (uVar15 < 0x41) {
      do {
        if (lVar7 < 8) {
          if (lVar7 == 0) {
            lVar7 = 0;
            break;
          }
          uVar6 = uVar15 >> 3;
          bVar23 = cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)uVar6));
          if (!bVar23) {
            uVar6 = (uint)lVar7;
          }
          uVar15 = uVar15 + uVar6 * -8;
        }
        else {
          uVar6 = uVar15 >> 3;
          uVar15 = uVar15 & 7;
          bVar23 = true;
        }
        lVar7 = lVar7 - (ulong)uVar6;
        uVar17 = *(ulong *)((long)cSrc + lVar7);
        if ((puVar9 <= puVar20) || (!bVar23)) break;
        uVar12 = (ulong)(ushort)dt[uVar11 + 1];
        bVar1 = *(byte *)((long)dt + uVar11 * 4 + 7);
        iVar14 = uVar15 + bVar1;
        uVar22 = (uVar17 << ((byte)uVar15 & 0x3f)) >> (-bVar1 & 0x3f);
        *puVar20 = *(undefined1 *)((long)dt + uVar11 * 4 + 6);
        uVar18 = (ulong)(ushort)dt[uVar10 + 1];
        bVar1 = *(byte *)((long)dt + uVar10 * 4 + 7);
        iVar16 = iVar14 + (uint)bVar1;
        uVar13 = (uVar17 << ((byte)iVar14 & 0x3f)) >> (-bVar1 & 0x3f);
        puVar20[1] = *(undefined1 *)((long)dt + uVar10 * 4 + 6);
        lVar19 = uVar22 * 4;
        bVar1 = *(byte *)((long)dt + uVar12 * 4 + lVar19 + 7);
        iVar14 = iVar16 + (uint)bVar1;
        uVar11 = ((uVar17 << ((byte)iVar16 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)(ushort)dt[uVar22 + uVar12 + 1];
        puVar20[2] = *(undefined1 *)((long)dt + uVar12 * 4 + lVar19 + 6);
        lVar19 = uVar13 * 4;
        bVar1 = *(byte *)((long)dt + uVar18 * 4 + lVar19 + 7);
        uVar15 = iVar14 + (uint)bVar1;
        uVar10 = ((uVar17 << ((byte)iVar14 & 0x3f)) >> (-bVar1 & 0x3f)) +
                 (ulong)(ushort)dt[uVar13 + uVar18 + 1];
        puVar20[3] = *(undefined1 *)((long)dt + uVar18 * 4 + lVar19 + 6);
        puVar20 = puVar20 + 4;
        if (0x40 < uVar15) break;
      } while( true );
    }
    puVar9 = (undefined1 *)((long)dst + (originalSize - 2));
    if (puVar9 < puVar20) {
      return 0xffffffffffffffba;
    }
    lVar19 = (long)puVar20 - (long)dst;
    puVar20 = puVar20 + 1;
    while( true ) {
      FVar4 = dt[uVar11 + 1];
      bVar1 = *(byte *)((long)dt + uVar11 * 4 + 7);
      uVar12 = uVar17 << ((byte)uVar15 & 0x3f);
      uVar15 = uVar15 + bVar1;
      puVar20[-1] = *(undefined1 *)((long)dt + uVar11 * 4 + 6);
      if (0x40 < uVar15) break;
      if (lVar7 < 8) {
        if (lVar7 != 0) {
          uVar6 = (uint)lVar7;
          if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
            uVar6 = uVar15 >> 3;
          }
          uVar15 = uVar15 + uVar6 * -8;
          goto LAB_0050e0db;
        }
        lVar7 = 0;
      }
      else {
        uVar6 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
LAB_0050e0db:
        lVar7 = lVar7 - (ulong)uVar6;
        uVar17 = *(ulong *)((long)cSrc + lVar7);
      }
      if (puVar9 < puVar20) {
        return 0xffffffffffffffba;
      }
      FVar5 = dt[uVar10 + 1];
      bVar2 = *(byte *)((long)dt + uVar10 * 4 + 7);
      uVar13 = uVar17 << ((byte)uVar15 & 0x3f);
      uVar15 = uVar15 + bVar2;
      uVar11 = (uVar12 >> (-bVar1 & 0x3f)) + (ulong)(ushort)FVar4;
      *puVar20 = *(undefined1 *)((long)dt + uVar10 * 4 + 6);
      if (0x40 < uVar15) {
        puVar20 = puVar20 + 1;
        lVar7 = 3;
        uVar10 = uVar11;
        goto LAB_0050e1a1;
      }
      if (lVar7 < 8) {
        if (lVar7 != 0) {
          uVar6 = (uint)lVar7;
          if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
            uVar6 = uVar15 >> 3;
          }
          uVar15 = uVar15 + uVar6 * -8;
          goto LAB_0050e159;
        }
        lVar7 = 0;
      }
      else {
        uVar6 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
LAB_0050e159:
        lVar7 = lVar7 - (ulong)uVar6;
        uVar17 = *(ulong *)((long)cSrc + lVar7);
      }
      uVar10 = (uVar13 >> (-bVar2 & 0x3f)) + (ulong)(ushort)FVar5;
      lVar19 = lVar19 + 2;
      puVar21 = puVar20 + 1;
      puVar20 = puVar20 + 2;
      if (puVar9 < puVar21) {
        return 0xffffffffffffffba;
      }
    }
    lVar7 = 2;
LAB_0050e1a1:
    *puVar20 = *(undefined1 *)((long)dt + uVar10 * 4 + 6);
    goto LAB_0050e325;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  if (cSrcSize < 8) {
    uVar17 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar17 = uVar17 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar1 == 0) {
      return 0xffffffffffffffec;
    }
    uVar15 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    iVar14 = (uVar15 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar7 = 0;
  }
  else {
    bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar1 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar17 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar7 = cSrcSize - 8;
    uVar15 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    iVar14 = ~uVar15 + 9;
  }
  uVar3 = (ushort)*dt;
  uVar15 = iVar14 + (uint)uVar3;
  uVar10 = uVar17 >> (-(char)uVar15 & 0x3fU);
  if (uVar15 < 0x41) {
    if (lVar7 < 8) {
      if (lVar7 == 0) {
        lVar7 = 0;
        goto LAB_0050deb1;
      }
      uVar6 = (uint)lVar7;
      if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
        uVar6 = uVar15 >> 3;
      }
      uVar15 = uVar15 + uVar6 * -8;
    }
    else {
      uVar6 = uVar15 >> 3;
      uVar15 = uVar15 & 7;
    }
    lVar7 = lVar7 - (ulong)uVar6;
    uVar17 = *(ulong *)((long)cSrc + lVar7);
  }
LAB_0050deb1:
  uVar15 = uVar15 + uVar3;
  uVar11 = (ulong)((uint)uVar10 & BIT_mask[uVar3]);
  uVar10 = (ulong)(BIT_mask[uVar3] & (uint)(uVar17 >> (-(char)uVar15 & 0x3fU)));
  if (uVar15 < 0x41) {
    if (lVar7 < 8) {
      if (lVar7 == 0) {
        lVar7 = 0;
        goto LAB_0050df08;
      }
      uVar6 = (uint)lVar7;
      if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
        uVar6 = uVar15 >> 3;
      }
      uVar15 = uVar15 + uVar6 * -8;
    }
    else {
      uVar6 = uVar15 >> 3;
      uVar15 = uVar15 & 7;
    }
    lVar7 = lVar7 - (ulong)uVar6;
    uVar17 = *(ulong *)((long)cSrc + lVar7);
  }
LAB_0050df08:
  puVar20 = (undefined1 *)dst;
  if (uVar15 < 0x41) {
    do {
      if (lVar7 < 8) {
        if (lVar7 == 0) {
          lVar7 = 0;
          break;
        }
        uVar6 = uVar15 >> 3;
        bVar23 = cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)uVar6));
        if (!bVar23) {
          uVar6 = (uint)lVar7;
        }
        uVar15 = uVar15 + uVar6 * -8;
      }
      else {
        uVar6 = uVar15 >> 3;
        uVar15 = uVar15 & 7;
        bVar23 = true;
      }
      lVar7 = lVar7 - (ulong)uVar6;
      uVar17 = *(ulong *)((long)cSrc + lVar7);
      if ((puVar9 <= puVar20) || (!bVar23)) break;
      uVar12 = (ulong)(ushort)dt[uVar11 + 1];
      bVar1 = *(byte *)((long)dt + uVar11 * 4 + 7);
      iVar14 = uVar15 + bVar1;
      uVar22 = (ulong)((uint)(uVar17 >> (-(char)iVar14 & 0x3fU)) & BIT_mask[bVar1]);
      *puVar20 = *(undefined1 *)((long)dt + uVar11 * 4 + 6);
      bVar1 = *(byte *)((long)dt + uVar10 * 4 + 7);
      iVar14 = iVar14 + (uint)bVar1;
      uVar13 = (ulong)(ushort)dt[uVar10 + 1];
      uVar18 = (ulong)((uint)(uVar17 >> (-(char)iVar14 & 0x3fU)) & BIT_mask[bVar1]);
      puVar20[1] = *(undefined1 *)((long)dt + uVar10 * 4 + 6);
      lVar19 = uVar22 * 4;
      bVar1 = *(byte *)((long)dt + uVar12 * 4 + lVar19 + 7);
      iVar14 = iVar14 + (uint)bVar1;
      uVar11 = (ulong)((uint)(uVar17 >> (-(char)iVar14 & 0x3fU)) & BIT_mask[bVar1]) +
               (ulong)(ushort)dt[uVar22 + uVar12 + 1];
      puVar20[2] = *(undefined1 *)((long)dt + uVar12 * 4 + lVar19 + 6);
      lVar19 = uVar18 * 4;
      bVar1 = *(byte *)((long)dt + uVar13 * 4 + lVar19 + 7);
      uVar15 = iVar14 + (uint)bVar1;
      uVar10 = (ulong)((uint)(uVar17 >> (-(char)uVar15 & 0x3fU)) & BIT_mask[bVar1]) +
               (ulong)(ushort)dt[uVar18 + uVar13 + 1];
      puVar20[3] = *(undefined1 *)((long)dt + uVar13 * 4 + lVar19 + 6);
      puVar20 = puVar20 + 4;
      if (0x40 < uVar15) break;
    } while( true );
  }
  puVar9 = (undefined1 *)((long)dst + (originalSize - 2));
  if (puVar9 < puVar20) {
    return 0xffffffffffffffba;
  }
  lVar19 = (long)puVar20 - (long)dst;
  puVar20 = puVar20 + 1;
  while( true ) {
    FVar4 = dt[uVar11 + 1];
    bVar1 = *(byte *)((long)dt + uVar11 * 4 + 7);
    uVar15 = uVar15 + bVar1;
    uVar12 = uVar17 >> (-(char)uVar15 & 0x3fU);
    uVar6 = BIT_mask[bVar1];
    puVar20[-1] = *(undefined1 *)((long)dt + uVar11 * 4 + 6);
    if (0x40 < uVar15) break;
    if (lVar7 < 8) {
      if (lVar7 != 0) {
        uVar8 = (uint)lVar7;
        if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
          uVar8 = uVar15 >> 3;
        }
        uVar15 = uVar15 + uVar8 * -8;
        goto LAB_0050e25a;
      }
      lVar7 = 0;
    }
    else {
      uVar8 = uVar15 >> 3;
      uVar15 = uVar15 & 7;
LAB_0050e25a:
      lVar7 = lVar7 - (ulong)uVar8;
      uVar17 = *(ulong *)((long)cSrc + lVar7);
    }
    if (puVar9 < puVar20) {
      return 0xffffffffffffffba;
    }
    uVar11 = (ulong)((uint)uVar12 & uVar6) + (ulong)(ushort)FVar4;
    FVar4 = dt[uVar10 + 1];
    bVar1 = *(byte *)((long)dt + uVar10 * 4 + 7);
    uVar15 = uVar15 + bVar1;
    uVar12 = uVar17 >> (-(char)uVar15 & 0x3fU);
    uVar6 = BIT_mask[bVar1];
    *puVar20 = *(undefined1 *)((long)dt + uVar10 * 4 + 6);
    if (0x40 < uVar15) {
      puVar20 = puVar20 + 1;
      lVar7 = 3;
      uVar10 = uVar11;
      goto LAB_0050e31c;
    }
    if (lVar7 < 8) {
      if (lVar7 != 0) {
        uVar8 = (uint)lVar7;
        if (cSrc <= (void *)((long)cSrc + (lVar7 - (ulong)(uVar15 >> 3)))) {
          uVar8 = uVar15 >> 3;
        }
        uVar15 = uVar15 + uVar8 * -8;
        goto LAB_0050e2d8;
      }
      lVar7 = 0;
    }
    else {
      uVar8 = uVar15 >> 3;
      uVar15 = uVar15 & 7;
LAB_0050e2d8:
      lVar7 = lVar7 - (ulong)uVar8;
      uVar17 = *(ulong *)((long)cSrc + lVar7);
    }
    uVar10 = (ulong)((uint)uVar12 & uVar6) + (ulong)(ushort)FVar4;
    lVar19 = lVar19 + 2;
    puVar21 = puVar20 + 1;
    puVar20 = puVar20 + 2;
    if (puVar9 < puVar21) {
      return 0xffffffffffffffba;
    }
  }
  lVar7 = 2;
LAB_0050e31c:
  *puVar20 = *(undefined1 *)((long)dt + uVar10 * 4 + 6);
LAB_0050e325:
  return lVar7 + lVar19;
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}